

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_waiter.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::synchronization_internal::PthreadWaiter::PthreadWaiter(PthreadWaiter *this)

{
  uint uVar1;
  undefined8 in_R9;
  char *absl_raw_log_internal_basename_1;
  int err2;
  char *absl_raw_log_internal_basename;
  int err;
  PthreadWaiter *this_local;
  
  this->waiter_count_ = 0;
  this->wakeup_count_ = 0;
  uVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (uVar1 != 0) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"pthread_waiter.cc",0x44,"pthread_mutex_init failed: %d",(ulong)uVar1);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/internal/pthread_waiter.cc"
                  ,0x44,"absl::synchronization_internal::PthreadWaiter::PthreadWaiter()");
  }
  uVar1 = pthread_cond_init((pthread_cond_t *)&this->cv_,(pthread_condattr_t *)0x0);
  if (uVar1 != 0) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"pthread_waiter.cc",0x49,"pthread_cond_init failed: %d",(ulong)uVar1,in_R9,
               this,"pthread_waiter.cc");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/internal/pthread_waiter.cc"
                  ,0x49,"absl::synchronization_internal::PthreadWaiter::PthreadWaiter()");
  }
  return;
}

Assistant:

PthreadWaiter::PthreadWaiter() : waiter_count_(0), wakeup_count_(0) {
  const int err = pthread_mutex_init(&mu_, 0);
  if (err != 0) {
    ABSL_RAW_LOG(FATAL, "pthread_mutex_init failed: %d", err);
  }

  const int err2 = pthread_cond_init(&cv_, 0);
  if (err2 != 0) {
    ABSL_RAW_LOG(FATAL, "pthread_cond_init failed: %d", err2);
  }
}